

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

Statement * parseState(string *line,bool flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  StateIf *this;
  CompoundExp *this_00;
  undefined **ppuVar7;
  long lVar8;
  Expression *pEVar9;
  Expression *pEVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  string s;
  __string_type __str;
  string s1;
  string first_token;
  string s2;
  TokenScanner scanner;
  string token;
  string local_360;
  string local_338;
  string local_318;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  string local_2d8;
  TokenScanner local_2b8;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130 [2];
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  TokenScanner::TokenScanner(&local_2b8);
  TokenScanner::ignoreWhitespace(&local_2b8);
  TokenScanner::scanNumbers(&local_2b8);
  pcVar3 = (line->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + line->_M_string_length);
  TokenScanner::setInput(&local_2b8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_2f8 = &local_2e8;
  local_2f0 = 0;
  local_2e8 = 0;
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  if (flag) {
    TokenScanner::nextToken_abi_cxx11_(&local_360,&local_2b8);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,
                      CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                               local_360.field_2._M_local_buf[0]) + 1);
    }
  }
  TokenScanner::nextToken_abi_cxx11_(&local_360,&local_2b8);
  std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_360);
  paVar1 = &local_360.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar1) {
    operator_delete(local_360._M_dataplus._M_p,
                    CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                             local_360.field_2._M_local_buf[0]) + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar5 == 0) {
    this = (StateIf *)operator_new(0x10);
    StateLet::StateLet((StateLet *)this,&local_2b8);
    goto LAB_0010a792;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar5 == 0) {
    this_00 = (CompoundExp *)parseExp(&local_2b8);
    iVar5 = (*(this_00->super_Expression)._vptr_Expression[4])(this_00);
    if (iVar5 == 2) {
      CompoundExp::getOp_abi_cxx11_(&local_360,this_00);
      iVar5 = std::__cxx11::string::compare((char *)&local_360);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != paVar1) {
        operator_delete(local_360._M_dataplus._M_p,
                        CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                 local_360.field_2._M_local_buf[0]) + 1);
      }
      if (iVar5 == 0) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SYNTAX ERROR","");
        error(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    this = (StateIf *)operator_new(0x10);
    (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__StatePrint_00110be8;
    this->exp1 = (Expression *)this_00;
    goto LAB_0010a792;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar5 == 0) {
    pEVar9 = parseExp(&local_2b8);
    iVar5 = (*pEVar9->_vptr_Expression[4])(pEVar9);
    if (iVar5 != 1) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SYNTAX ERROR","");
      error(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    this = (StateIf *)operator_new(0x10);
    (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__StateInput_00110bc0;
    this->exp1 = pEVar9;
    goto LAB_0010a792;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar5 == 0) {
    this = (StateIf *)operator_new(8);
    ppuVar7 = &PTR__StateRem_00110b48;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
      if (iVar5 == 0) {
        lVar8 = std::__cxx11::string::find((char *)line,0x10c081,0);
        if (lVar8 == -1) {
          pEVar9 = readE(&local_2b8,0);
          TokenScanner::nextToken_abi_cxx11_(&local_360,&local_2b8);
          pEVar10 = readE(&local_2b8,0);
          TokenScanner::nextToken_abi_cxx11_(&local_318,&local_2b8);
          TokenScanner::nextToken_abi_cxx11_(&local_2d8,&local_2b8);
          std::__cxx11::string::operator=((string *)&local_318,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,
                            CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                     local_2d8.field_2._M_local_buf[0]) + 1);
          }
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_318._M_dataplus._M_p,
                     local_318._M_dataplus._M_p + local_318._M_string_length);
          iVar5 = stringToInteger(&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_360);
          if ((((iVar6 != 0) &&
               (iVar6 = std::__cxx11::string::compare((char *)&local_360), iVar6 != 0)) &&
              (iVar6 = std::__cxx11::string::compare((char *)&local_360), iVar6 != 0)) ||
             (bVar4 = TokenScanner::hasMoreTokens(&local_2b8), bVar4)) {
            if (pEVar9 != (Expression *)0x0) {
              (*pEVar9->_vptr_Expression[1])(pEVar9);
            }
            if (pEVar10 != (Expression *)0x0) {
              (*pEVar10->_vptr_Expression[1])(pEVar10);
            }
            local_130[0]._M_dataplus._M_p = (pointer)&local_130[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"SYNTAX ERROR","");
            error(local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130[0]._M_dataplus._M_p != &local_130[0].field_2) {
              operator_delete(local_130[0]._M_dataplus._M_p,
                              local_130[0].field_2._M_allocated_capacity + 1);
            }
          }
          this = (StateIf *)operator_new(0x40);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_360._M_dataplus._M_p,
                     local_360._M_dataplus._M_p + local_360._M_string_length);
          StateIf::StateIf(this,pEVar9,&local_150,pEVar10,iVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,
                            CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                     local_318.field_2._M_local_buf[0]) + 1);
          }
          goto joined_r0x0010a53e;
        }
        local_360._M_string_length = 0;
        local_360.field_2._M_local_buf[0] = '\0';
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318._M_string_length = 0;
        local_318.field_2._M_local_buf[0] = '\0';
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        local_2d8._M_string_length = 0;
        local_2d8.field_2._M_local_buf[0] = '\0';
        paVar2 = &local_338.field_2;
        local_360._M_dataplus._M_p = (pointer)paVar1;
        while (bVar4 = TokenScanner::hasMoreTokens(&local_2b8), bVar4) {
          TokenScanner::nextToken_abi_cxx11_(&local_338,&local_2b8);
          std::__cxx11::string::operator=((string *)&local_360,(string *)&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != paVar2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          iVar5 = std::__cxx11::string::compare((char *)&local_360);
          if (iVar5 == 0) break;
          local_338._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_338,local_360._M_dataplus._M_p,
                     local_360._M_dataplus._M_p + local_360._M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&local_338,local_338._M_string_length,0,'\x01');
          std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_338._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != paVar2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
        }
        while (bVar4 = TokenScanner::hasMoreTokens(&local_2b8), bVar4) {
          TokenScanner::nextToken_abi_cxx11_(&local_338,&local_2b8);
          std::__cxx11::string::operator=((string *)&local_360,(string *)&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != paVar2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          iVar5 = std::__cxx11::string::compare((char *)&local_360);
          if (iVar5 == 0) break;
          local_338._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_338,local_360._M_dataplus._M_p,
                     local_360._M_dataplus._M_p + local_360._M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&local_338,local_338._M_string_length,0,'\x01');
          std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_338._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != paVar2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
        }
        bVar4 = TokenScanner::hasMoreTokens(&local_2b8);
        if (bVar4) {
          TokenScanner::nextToken_abi_cxx11_(&local_338,&local_2b8);
          std::__cxx11::string::operator=((string *)&local_360,(string *)&local_338);
          local_170.field_2._M_allocated_capacity = local_338.field_2._M_allocated_capacity;
          _Var12._M_p = local_338._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != paVar2) {
LAB_0010a592:
            operator_delete(_Var12._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"SYNTAX ERROR","");
          error(&local_170);
          _Var12._M_p = local_170._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) goto LAB_0010a592;
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        TokenScanner::setInput(&local_2b8,&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        pEVar9 = parseExp(&local_2b8);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,local_2d8._M_dataplus._M_p,
                   local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
        TokenScanner::setInput(&local_2b8,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        pEVar10 = parseExp(&local_2b8);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,local_360._M_dataplus._M_p,
                   local_360._M_dataplus._M_p + local_360._M_string_length);
        iVar5 = stringToInteger(&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        this = (StateIf *)operator_new(0x40);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"=","");
        StateIf::StateIf(this,pEVar9,&local_1f0,pEVar10,iVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,
                          CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                   local_2d8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                   local_318.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_0010a792;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_2f8);
        if (iVar5 != 0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SYNTAX ERROR","");
          error(&local_50);
          uVar11 = std::__cxx11::string::~string((string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130[0]._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_130[0]._M_dataplus._M_p,
                            local_130[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,
                            CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                     local_318.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != paVar1) {
            operator_delete(local_360._M_dataplus._M_p,
                            CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                                     local_360.field_2._M_local_buf[0]) + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
          }
          TokenScanner::~TokenScanner(&local_2b8);
          _Unwind_Resume(uVar11);
        }
        TokenScanner::nextToken_abi_cxx11_(&local_360,&local_2b8);
        bVar4 = TokenScanner::hasMoreTokens(&local_2b8);
        if (bVar4) {
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"SYNTAX ERROR","");
          error(&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,local_360._M_dataplus._M_p,
                   local_360._M_dataplus._M_p + local_360._M_string_length);
        iVar5 = stringToInteger(&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        this = (StateIf *)operator_new(0x10);
        (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__StateRem_00110c38;
        *(int *)&this->exp1 = iVar5;
joined_r0x0010a53e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p == paVar1) goto LAB_0010a792;
      }
      operator_delete(local_360._M_dataplus._M_p,
                      CONCAT71(local_360.field_2._M_allocated_capacity._1_7_,
                               local_360.field_2._M_local_buf[0]) + 1);
      goto LAB_0010a792;
    }
    this = (StateIf *)operator_new(8);
    ppuVar7 = &PTR__StateRem_00110c10;
  }
  (this->super_Statement)._vptr_Statement = (_func_int **)ppuVar7;
LAB_0010a792:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
  }
  TokenScanner::~TokenScanner(&local_2b8);
  return &this->super_Statement;
}

Assistant:

Statement *parseState(string line, bool flag) {
    TokenScanner scanner;
    scanner.ignoreWhitespace();
    scanner.scanNumbers();
    scanner.setInput(line);
    string first_token, token;
    if (flag) {
        first_token = scanner.nextToken();
    }
    Statement *sta = nullptr;
    Expression *exp = nullptr;
    Expression *exp1 = nullptr;
    Expression *exp2 = nullptr;
    first_token = scanner.nextToken();
    if (first_token == "LET") {
        try {
            sta = new StateLet(scanner);
            return sta;
        }
        catch (ErrorException err) {
            if (sta != nullptr) delete sta;
            throw err;
        } catch (...) {

        }
    } else if (first_token == "PRINT") {
        try {
            exp = parseExp(scanner);
            if (exp->getType()==COMPOUND)
                if (((CompoundExp*)exp)->getOp()=="=") error("SYNTAX ERROR");
            sta = new StatePrint(exp);
            return sta;
        } catch (ErrorException err) {
            if (exp != nullptr) delete exp;
            if (sta != nullptr) delete sta;
            throw err;
        }
    } else if (first_token == "INPUT") {
        try {
            exp = parseExp(scanner);
            if (exp->getType() != IDENTIFIER) error("SYNTAX ERROR");
            return new StateInput(exp);
        } catch (ErrorException err) {
            if (exp != nullptr) delete exp;
            throw err;
        } catch (...) {
            if (exp != nullptr) delete exp;
        }
    } else if (first_token == "REM") {
        return new StateRem;
    } else if (first_token == "END") {
        return new StateEnd;
    } else if (first_token == "IF") {
        if (line.find("=") == string::npos) {
            exp1 = readE(scanner);
            string cmp = scanner.nextToken();
            exp2 = readE(scanner);
            string tmp = scanner.nextToken();
            tmp = scanner.nextToken();
            int line_number;
            try {
                line_number = stringToInteger(tmp);
            } catch (...) {
                delete exp1;
                delete exp2;
                error("SYNTAX ERROR");
            }
            if ((cmp != "=" && cmp != "<" && cmp != ">") || scanner.hasMoreTokens()) {
                delete exp1;
                delete exp2;
                error("SYNTAX ERROR");
            }
            return new StateIf(exp1, cmp, exp2, line_number);
        }else {
            string token,s1,s2;
            while (scanner.hasMoreTokens()){
                token=scanner.nextToken();
                if (token=="=") break;
                s1+=token+' ';
            }
            while (scanner.hasMoreTokens()){
                token=scanner.nextToken();
                if (token=="THEN") break;
                s2+=token+' ';
            }
            if (scanner.hasMoreTokens())
                token=scanner.nextToken();
            else error("SYNTAX ERROR");
            scanner.setInput(s1);
            exp1=parseExp(scanner);
            scanner.setInput(s2);
            exp2=parseExp(scanner);
            int line_number=stringToInteger(token);
            return new StateIf(exp1,"=",exp2,line_number);
        }
    } else if (first_token == "GOTO") {
        string s = scanner.nextToken();
        int lineNumber;
        if (scanner.hasMoreTokens()) error("SYNTAX ERROR");
        try {
            lineNumber = stringToInteger(s);
        } catch (...) {
            error("SYNTAX ERROR");
        }
        return new StateGoto(lineNumber);
    } else error("SYNTAX ERROR");
}